

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPacked
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix,
          Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
          *checkUnpacked)

{
  byte bVar1;
  Iface *pIVar2;
  uchar *puVar3;
  RemoveConst<unsigned_char> *pRVar4;
  uchar *puVar5;
  Plausibility PVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  size_t sVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  Vector<unsigned_char> unpacked;
  Vector<unsigned_char> local_58;
  Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
  *local_38;
  
  pbVar14 = prefix.ptr;
  local_58.builder.ptr = (byte *)0x0;
  local_58.builder.pos = (byte *)0x0;
  local_58.builder.endPtr = (byte *)0x0;
  local_58.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  sVar11 = 0x400;
  if ((long)prefix.size_ < 0x400) {
    sVar11 = prefix.size_;
  }
  pbVar13 = pbVar14 + sVar11;
  local_38 = checkUnpacked;
  do {
    if (pbVar13 <= pbVar14) goto LAB_00120b78;
    bVar1 = *pbVar14;
    pbVar14 = pbVar14 + 1;
    iVar15 = 4;
    bVar16 = pbVar13 <= pbVar14;
    if (!bVar16) {
      uVar8 = 0;
      do {
        if ((bVar1 >> (uVar8 & 0x1f) & 1) == 0) {
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar11 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<unsigned_char>::setCapacity(&local_58,sVar11);
          }
          bVar10 = 0;
        }
        else {
          bVar10 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          if (bVar10 == 0) {
            iVar15 = 1;
            break;
          }
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar11 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<unsigned_char>::setCapacity(&local_58,sVar11);
          }
        }
        *local_58.builder.pos = bVar10;
        local_58.builder.pos = local_58.builder.pos + 1;
        bVar17 = 6 < uVar8;
        uVar8 = uVar8 + 1;
        bVar16 = pbVar13 <= pbVar14 || bVar17;
      } while (pbVar13 > pbVar14 && !bVar17);
    }
    if (bVar16) {
      if (pbVar14 == pbVar13) {
        iVar15 = 3;
      }
      else {
        iVar15 = 0;
        if (bVar1 == 0xff) {
          uVar9 = (long)pbVar13 - (long)(pbVar14 + 1);
          if ((ulong)*pbVar14 << 3 <= uVar9) {
            uVar9 = (ulong)*pbVar14 << 3;
          }
          pbVar7 = local_58.builder.pos + (uVar9 - (long)local_58.builder.ptr);
          if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar7) {
            pbVar12 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pbVar12 = (byte *)0x4;
            }
            if (pbVar12 < pbVar7) {
              pbVar12 = pbVar7;
            }
            kj::Vector<unsigned_char>::setCapacity(&local_58,(size_t)pbVar12);
          }
          pRVar4 = local_58.builder.pos;
          if (uVar9 != 0) {
            memcpy(local_58.builder.pos,pbVar14 + 1,uVar9);
            local_58.builder.pos = pRVar4 + uVar9;
          }
          pbVar14 = pbVar14 + uVar9 + 1;
        }
        else if (bVar1 == 0) {
          bVar1 = *pbVar14;
          uVar9 = (ulong)((uint)bVar1 * 8);
          pbVar7 = local_58.builder.pos + (uVar9 - (long)local_58.builder.ptr);
          if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar7) {
            pbVar12 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pbVar12 = (byte *)0x4;
            }
            if (pbVar12 < pbVar7) {
              pbVar12 = pbVar7;
            }
            kj::Vector<unsigned_char>::setCapacity(&local_58,(size_t)pbVar12);
          }
          pRVar4 = local_58.builder.pos;
          if (bVar1 != 0) {
            memset(local_58.builder.pos,0,uVar9);
            local_58.builder.pos = pRVar4 + uVar9;
          }
          pbVar14 = pbVar14 + 1;
        }
      }
    }
  } while (iVar15 == 0);
  if (iVar15 == 3) {
LAB_00120b78:
    pIVar2 = (local_38->impl).ptr;
    PVar6 = (**pIVar2->_vptr_Iface)
                      (pIVar2,local_58.builder.ptr,
                       (long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  else {
    PVar6 = IMPOSSIBLE;
  }
  puVar5 = local_58.builder.endPtr;
  pRVar4 = local_58.builder.pos;
  puVar3 = local_58.builder.ptr;
  if (local_58.builder.ptr != (byte *)0x0) {
    local_58.builder.ptr = (uchar *)0x0;
    local_58.builder.pos = (RemoveConst<unsigned_char> *)0x0;
    local_58.builder.endPtr = (uchar *)0x0;
    (**(local_58.builder.disposer)->_vptr_ArrayDisposer)
              (local_58.builder.disposer,puVar3,1,(long)pRVar4 - (long)puVar3,
               (long)puVar5 - (long)puVar3,0);
  }
  return PVar6;
}

Assistant:

Plausibility isPlausiblyPacked(kj::ArrayPtr<const byte> prefix,
      kj::Function<Plausibility(kj::ArrayPtr<const byte>)> checkUnpacked) {
    kj::Vector<byte> unpacked;

    // Try to unpack a prefix so that we can check it.
    const byte* pos = prefix.begin();
    const byte* end = prefix.end();
    if (end - pos > 1024) {
      // Don't bother unpacking more than 1k.
      end = pos + 1024;
    }
    while (pos < end) {
      byte tag = *pos++;
      for (uint i = 0; i < 8 && pos < end; i++) {
        if (tag & (1 << i)) {
          byte b = *pos++;
          if (b == 0) {
            // A zero byte should have been deflated away.
            return IMPOSSIBLE;
          }
          unpacked.add(b);
        } else {
          unpacked.add(0);
        }
      }

      if (pos == end) {
        break;
      }

      if (tag == 0) {
        uint count = *pos++ * 8;
        unpacked.addAll(kj::repeat(byte(0), count));
      } else if (tag == 0xff) {
        uint count = *pos++ * 8;
        size_t available = end - pos;
        uint n = kj::min(count, available);
        unpacked.addAll(pos, pos + n);
        pos += n;
      }
    }

    return checkUnpacked(unpacked);
  }